

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

StructSymbol * __thiscall StructTable::cSearch(StructTable *this,char *lexeme)

{
  int iVar1;
  char *pcVar2;
  char *__s2;
  char *__s2_00;
  char *__s1;
  int iVar3;
  StructSymbol *pSVar4;
  
  if ((lexeme != (char *)0x0) &&
     (pSVar4 = (StructSymbol *)SymbolTable::cSearch(&this->super_SymbolTable,lexeme),
     pSVar4 != (StructSymbol *)0x0)) {
    iVar1 = (this->super_SymbolTable).currentScope;
    pcVar2 = (this->super_SymbolTable).lexemeArray;
    __s2 = (this->super_SymbolTable).currentScopeLexeme;
    __s2_00 = (this->super_SymbolTable).previousScopeLexeme;
    do {
      if (iVar1 < (pSVar4->super_Symbol).scope) {
        return (StructSymbol *)0x0;
      }
      iVar3 = strcmp(pcVar2 + (pSVar4->super_Symbol).lexemeIndex,lexeme);
      __s1 = (pSVar4->super_Symbol).lexemeScope;
      if ((iVar3 == 0) && (iVar3 = strcmp(__s1,__s2), iVar3 == 0)) {
        return pSVar4;
      }
      iVar3 = strcmp(__s1,__s2_00);
      if (iVar3 == 0) {
        return pSVar4;
      }
      iVar3 = strcmp(__s1,"nonLocal");
      if (iVar3 == 0) {
        return pSVar4;
      }
      pSVar4 = (StructSymbol *)(pSVar4->super_Symbol).nextSymbol;
    } while (pSVar4 != (StructSymbol *)0x0);
  }
  return (StructSymbol *)0x0;
}

Assistant:

StructSymbol *StructTable::cSearch(const char *lexeme) {
    if (lexeme != NULL) {
        StructSymbol *structSymbol = (StructSymbol *) SymbolTable::cSearch(lexeme);
        while (structSymbol != NULL && structSymbol->getScope() <= currentScope) {
            if ((!strcmp(lexemeArray + structSymbol->getLexemeIndex(), lexeme) &&
                 structSymbol->isScope(currentScopeLexeme)) ||
                structSymbol->isScope(previousScopeLexeme) || structSymbol->isScope("nonLocal")) {
                return structSymbol;
            }
            structSymbol = (StructSymbol *) structSymbol->getNextSymbol();
        }
    }
    return NULL;
}